

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O1

bool __thiscall FConfigFile::ReadConfig(FConfigFile *this,void *file)

{
  char cVar1;
  FConfigFile *pFVar2;
  char *pcVar3;
  undefined1 auVar4 [8];
  int iVar5;
  undefined4 extraout_var;
  size_t sVar6;
  undefined4 extraout_var_00;
  FConfigFile *pFVar7;
  FConfigFile *pFVar8;
  FConfigFile *pFVar9;
  FConfigFile *__s;
  bool bVar10;
  char *endtag;
  bool bVar11;
  char readbuf [256];
  FConfigSection *local_150;
  undefined1 local_140 [8];
  char local_138 [264];
  
  ClearConfig(this);
  iVar5 = (*this->_vptr_FConfigFile[3])(this,local_138,0x100,file);
  bVar11 = CONCAT44(extraout_var,iVar5) == 0;
  if (!bVar11) {
    local_150 = (FConfigSection *)0x0;
    do {
      __s = (FConfigFile *)(local_140 + 7);
      do {
        pFVar9 = __s;
        __s = (FConfigFile *)((long)&pFVar9->_vptr_FConfigFile + 1);
        cVar1 = *(char *)((long)&pFVar9->_vptr_FConfigFile + 1);
        if (cVar1 == '\0') break;
      } while (cVar1 < '!');
      bVar10 = false;
      if ((cVar1 != '#') &&
         ((cVar1 != '/' || (*(char *)((long)&pFVar9->_vptr_FConfigFile + 2) != '/')))) {
        sVar6 = strlen((char *)__s);
        pFVar8 = (FConfigFile *)((long)&pFVar9->_vptr_FConfigFile + sVar6);
        do {
          pFVar7 = pFVar8;
          if (pFVar7 <= __s) {
            *(undefined1 *)((long)&pFVar7->_vptr_FConfigFile + 1) = 0;
            goto LAB_0035d882;
          }
          pFVar8 = (FConfigFile *)((long)&pFVar7[-1].PathName.Chars + 7);
        } while (*(char *)&pFVar7->_vptr_FConfigFile < '!');
        *(undefined1 *)((long)&pFVar7->_vptr_FConfigFile + 1) = 0;
        if (__s < pFVar7) {
          if (*(char *)&__s->_vptr_FConfigFile == '[') {
            if (*(char *)&pFVar7->_vptr_FConfigFile == ']') {
              *(undefined1 *)&pFVar7->_vptr_FConfigFile = 0;
            }
            local_150 = NewConfigSection(this,(char *)((long)&pFVar9->_vptr_FConfigFile + 2));
            bVar10 = false;
          }
          else if (local_150 == (FConfigSection *)0x0) {
            bVar10 = true;
            local_150 = (FConfigSection *)0x0;
          }
          else {
            pFVar9 = __s;
            pFVar7 = (FConfigFile *)strchr((char *)__s,0x3d);
            bVar10 = false;
            pFVar8 = pFVar7;
            auVar4 = (undefined1  [8])file;
            if (__s < pFVar7) {
              do {
                local_140 = auVar4;
                pFVar2 = pFVar8;
                pFVar8 = (FConfigFile *)((long)&pFVar2[-1].PathName.Chars + 7);
                if (pFVar8 <= __s) break;
                pFVar9 = (FConfigFile *)(ulong)(uint)(int)*(char *)&pFVar8->_vptr_FConfigFile;
                iVar5 = isspace((int)*(char *)&pFVar8->_vptr_FConfigFile);
                auVar4 = local_140;
              } while (iVar5 != 0);
              *(char *)&pFVar2->_vptr_FConfigFile = '\0';
              pcVar3 = (char *)((long)&pFVar7->_vptr_FConfigFile + 4);
              do {
                endtag = pcVar3;
                cVar1 = endtag[-3];
                if (cVar1 == '\0') break;
                pFVar9 = (FConfigFile *)(ulong)(uint)(int)cVar1;
                iVar5 = isspace((int)cVar1);
                pcVar3 = endtag + 1;
              } while (iVar5 != 0);
              file = (void *)local_140;
              endtag[-4] = '\0';
              if ((((cVar1 == '<') && (endtag[-2] == '<')) && (endtag[-1] == '<')) &&
                 (*endtag != '\0')) {
                ReadMultiLineValue(this,(void *)local_140,local_150,(char *)__s,endtag);
              }
              else {
                NewConfigEntry(pFVar9,local_150,(char *)__s,endtag + -3);
                file = (void *)local_140;
              }
            }
          }
        }
      }
LAB_0035d882:
      if (bVar10) {
        return bVar11;
      }
      iVar5 = (*this->_vptr_FConfigFile[3])(this,local_138,0x100,file);
      bVar11 = CONCAT44(extraout_var_00,iVar5) == 0;
    } while (!bVar11);
  }
  return bVar11;
}

Assistant:

bool FConfigFile::ReadConfig (void *file)
{
	char readbuf[READBUFFERSIZE];
	FConfigSection *section = NULL;
	ClearConfig ();

	while (ReadLine (readbuf, READBUFFERSIZE, file) != NULL)
	{
		char *start = readbuf;
		char *equalpt;
		char *endpt;

		// Remove white space at start of line
		while (*start && *start <= ' ')
		{
			start++;
		}
		// Remove comment lines
		if (*start == '#' || (start[0] == '/' && start[1] == '/'))
		{
			continue;
		}
		// Remove white space at end of line
		endpt = start + strlen (start) - 1;
		while (endpt > start && *endpt <= ' ')
		{
			endpt--;
		}
		endpt[1] = 0;
		if (endpt <= start)
			continue;	// Nothing here

		if (*start == '[')
		{ // Section header
			if (*endpt == ']')
				*endpt = 0;
			section = NewConfigSection (start+1);
		}
		else if (section == NULL)
		{
			return false;
		}
		else
		{ // Should be key=value
			equalpt = strchr (start, '=');
			if (equalpt != NULL && equalpt > start)
			{
				// Remove white space in front of =
				char *whiteprobe = equalpt - 1;
				while (whiteprobe > start && isspace(*whiteprobe))
				{
					whiteprobe--;
				}
				whiteprobe[1] = 0;
				// Remove white space after =
				whiteprobe = equalpt + 1;
				while (*whiteprobe && isspace(*whiteprobe))
				{
					whiteprobe++;
				}
				*(whiteprobe - 1) = 0;
				// Check for multi-line value
				if (whiteprobe[0] == '<' && whiteprobe[1] == '<' && whiteprobe[2] == '<' && whiteprobe[3] != '\0')
				{
					ReadMultiLineValue (file, section, start, whiteprobe + 3);
				}
				else
				{
					NewConfigEntry (section, start, whiteprobe);
				}
			}
		}
	}
	return true;
}